

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O1

void __thiscall nuraft::raft_server::check_leadership_transfer(raft_server *this)

{
  uint uVar1;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  _Hash_node_base this_00;
  element_type *peVar4;
  bool bVar5;
  int iVar6;
  uint64_t uVar7;
  __node_base *p_Var8;
  uint uVar9;
  unique_lock<std::recursive_mutex> guard;
  ptr<raft_params> params;
  uint local_84;
  unique_lock<std::recursive_mutex> local_70;
  undefined1 local_60 [16];
  _Alloc_hider local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  
  context::get_params((context *)local_60);
  if (*(int *)((long)&((element_type *)(local_60._0_8_ + 0x40))->_vptr_state_mgr + 4) != 0) {
    bVar5 = timer_helper::timeout(&this->leadership_transfer_timer_);
    if (bVar5) {
      context::get_params((context *)&stack0xffffffffffffffb0);
      iVar6 = *(int *)&((element_type *)(local_50._M_p + 8))->_vptr_state_machine;
      if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
      }
      local_70._M_device = &this->lock_;
      local_70._M_owns = false;
      std::unique_lock<std::recursive_mutex>::lock(&local_70);
      local_70._M_owns = true;
      uVar9 = this->my_priority_;
      uVar2 = (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i;
      p_Var8 = &(this->peers_)._M_h._M_before_begin;
      local_84 = 0xffffffff;
      while (p_Var8 = p_Var8->_M_nxt, p_Var8 != (__node_base *)0x0) {
        p_Var3 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var8 + 2))->_M_max_load_factor;
        this_00._M_nxt = p_Var8[3]._M_nxt;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00._M_nxt !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(this_00._M_nxt + 1) = *(int *)(this_00._M_nxt + 1) + 1;
            UNLOCK();
          }
          else {
            *(int *)(this_00._M_nxt + 1) = *(int *)(this_00._M_nxt + 1) + 1;
          }
        }
        uVar1 = *(uint *)((long)&p_Var3->_M_nxt[9]._M_nxt + 4);
        if ((int)uVar9 < (int)uVar1) {
          local_84 = *(uint *)&p_Var3->_M_nxt->_M_nxt;
          uVar9 = uVar1;
        }
        if ((ulong)((long)&(p_Var3[0x10]._M_nxt)->_M_nxt +
                   (long)*(int *)((long)&((element_type *)(local_60._0_8_ + 0x30))->_vptr_state_mgr
                                 + 4)) < uVar2) {
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00._M_nxt !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00._M_nxt);
          }
          break;
        }
        uVar7 = timer_helper::get_us((timer_helper *)(p_Var3 + 0x28));
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00._M_nxt !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00._M_nxt);
        }
        if ((ulong)(long)iVar6 < uVar7 / 1000) break;
      }
      if (((p_Var8 == (__node_base *)0x0) &&
          (local_84 != 0xffffffff && this->my_priority_ < (int)uVar9)) &&
         (iVar6 = (*((this->state_machine_).
                     super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    _vptr_state_machine[0x14])(), (char)iVar6 != '\0')) {
        peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar4 != (element_type *)0x0) && (iVar6 = (*peVar4->_vptr_logger[7])(), 3 < iVar6)) {
          peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          uVar1 = this->my_priority_;
          uVar7 = timer_helper::get_sec(&this->leadership_transfer_timer_);
          msg_if_given_abi_cxx11_
                    ((string *)&stack0xffffffffffffffb0,
                     "going to transfer leadership to %d, my priority %d, max priority %d, has been leader for %lu sec"
                     ,(ulong)local_84,(ulong)uVar1,(ulong)uVar9,uVar7);
          (*peVar4->_vptr_logger[8])
                    (peVar4,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"check_leadership_transfer",0x492,&stack0xffffffffffffffb0);
          if ((element_type *)local_50._M_p != (element_type *)&stack0xffffffffffffffc0) {
            operator_delete(local_50._M_p);
          }
        }
        yield_leadership(this,false,local_84);
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock(&local_70);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
  }
  return;
}

Assistant:

void raft_server::check_leadership_transfer() {
    ptr<raft_params> params = ctx_->get_params();
    if (!params->leadership_transfer_min_wait_time_) {
        // Transferring leadership is disabled.
        return;
    }
    if (!leadership_transfer_timer_.timeout()) {
        // Leadership period is too short.
        return;
    }

    size_t hb_interval_ms = ctx_->get_params()->heart_beat_interval_;

    recur_lock(lock_);

    int32 successor_id = -1;
    int32 max_priority = my_priority_;
    ulong cur_commit_idx = quick_commit_index_;
    for (auto& entry: peers_) {
        ptr<peer> peer_elem = entry.second;
        const srv_config& s_conf = peer_elem->get_config();
        int32 cur_priority = s_conf.get_priority();
        if (cur_priority > max_priority) {
            max_priority = cur_priority;
            successor_id = s_conf.get_id();
        }

        if (peer_elem->get_matched_idx() + params->stale_log_gap_ <
                cur_commit_idx) {
            // This peer is lagging behind.
            return;
        }

        uint64_t last_resp_ms = peer_elem->get_resp_timer_us() / 1000;
        if (last_resp_ms > hb_interval_ms) {
            // This replica is not responding.
            return;
        }
    }

    if (my_priority_ >= max_priority || successor_id == -1) {
        // This leader already has the highest priority.
        return;
    }

    if (!state_machine_->allow_leadership_transfer()) {
        // Although all conditions are met,
        // user does not want to transfer the leadership.
        return;
    }

    p_in( "going to transfer leadership to %d, "
          "my priority %d, max priority %d, "
          "has been leader for %" PRIu64 " sec",
          successor_id, my_priority_, max_priority,
          leadership_transfer_timer_.get_sec() );
    yield_leadership(false, successor_id);
}